

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTagType
          (BinaryReaderInterp *this,Index index,Index sig_index)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Location loc_1;
  TagType tag_type;
  Var local_70;
  
  tag_type.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  tag_type.super_ExternType._vptr_ExternType = (_func_int **)(this->filename_)._M_len;
  tag_type.super_ExternType._8_8_ = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  tag_type.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)loc_1.field_1.field_1.offset;
  Var::Var(&local_70,sig_index,&loc_1);
  RVar2 = SharedValidator::OnTag(&this->validator_,(Location *)&tag_type,&local_70);
  Var::~Var(&local_70);
  if (RVar2.enum_ != Error) {
    TagType::TagType(&tag_type,Exception,
                     &(this->module_->func_types).
                      super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                      ._M_impl.super__Vector_impl_data._M_start[sig_index].params);
    pMVar1 = this->module_;
    TagType::TagType((TagType *)&loc_1,&tag_type);
    std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>::
    emplace_back<wabt::interp::TagDesc>(&pMVar1->tags,(TagDesc *)&loc_1);
    TagType::~TagType((TagType *)&loc_1);
    std::vector<wabt::interp::TagType,_std::allocator<wabt::interp::TagType>_>::push_back
              (&this->tag_types_,&tag_type);
    TagType::~TagType(&tag_type);
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnTagType(Index index, Index sig_index) {
  CHECK_RESULT(validator_.OnTag(GetLocation(), Var(sig_index, GetLocation())));
  FuncType& func_type = module_.func_types[sig_index];
  TagType tag_type{TagAttr::Exception, func_type.params};
  module_.tags.push_back(TagDesc{tag_type});
  tag_types_.push_back(tag_type);
  return Result::Ok;
}